

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

ssize_t __thiscall
clask::response_writer::write(response_writer *this,int __fd,void *__buf,size_t __n)

{
  int __fd_00;
  int iVar1;
  void *__buf_00;
  ssize_t sVar2;
  string *content_local;
  response_writer *this_local;
  
  if ((this->header_out & 1U) == 0) {
    (*this->_vptr_response_writer[2])();
  }
  __fd_00 = this->s;
  __buf_00 = (void *)std::__cxx11::string::data();
  iVar1 = std::__cxx11::string::size();
  sVar2 = send(__fd_00,__buf_00,(long)iVar1,0x4000);
  return sVar2;
}

Assistant:

inline void response_writer::write(const std::string& content) {
  if (!header_out) {
    write_headers();
  }
  send(s, content.data(), (int) content.size(), MSG_NOSIGNAL);
}